

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetBooleanVerifier::verifyFloatRange
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLfloat min,GLfloat max)

{
  ostringstream *poVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  StateQueryMemoryWriteGuard<unsigned_char[2]> range;
  StateQueryMemoryWriteGuard<unsigned_char[2]> local_1c0;
  GLfloat local_1b8;
  GLfloat local_1b4;
  undefined1 local_1b0 [384];
  
  local_1c0.m_postguard[0] = 0xde;
  local_1c0.m_postguard[1] = 0xde;
  local_1c0.m_preguard[0] = 0xde;
  local_1c0.m_preguard[1] = 0xde;
  local_1c0.m_value[0] = 0xde;
  local_1c0.m_value[1] = 0xde;
  local_1b8 = max;
  local_1b4 = min;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1c0.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::verifyValidity
                    (&local_1c0,testCtx);
  if (bVar2) {
    if ((local_1c0.m_value[0] != '\0') || ((0.0 <= local_1b4 && (0.0 <= local_1b8)))) {
      if (local_1c0.m_value[1] != '\0') {
        return;
      }
      if ((local_1b4 <= 0.0) && (local_1b8 <= 0.0)) {
        return;
      }
      local_1b0._0_8_ = testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// ERROR: range [",0x11)
      ;
      std::ostream::_M_insert<double>((double)local_1b4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] is not in range [",0x13);
      pcVar5 = "non-boolean";
      pcVar4 = "non-boolean";
      if (local_1c0.m_value[0] == '\0') {
        pcVar4 = "GL_FALSE";
      }
      if (local_1c0.m_value[0] == '\x01') {
        pcVar4 = "GL_TRUE";
      }
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      if (local_1c0.m_value[1] == '\0') {
        pcVar5 = "GL_FALSE";
      }
      if (local_1c0.m_value[1] == '\x01') {
        pcVar5 = "GL_TRUE";
      }
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar5,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b0._0_8_ = testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// ERROR: range [",0x11)
      ;
      std::ostream::_M_insert<double>((double)local_1b4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] is not in range [",0x13);
      pcVar5 = "non-boolean";
      pcVar4 = "non-boolean";
      if (local_1c0.m_value[0] == '\0') {
        pcVar4 = "GL_FALSE";
      }
      if (local_1c0.m_value[0] == '\x01') {
        pcVar4 = "GL_TRUE";
      }
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar4,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      if (local_1c0.m_value[1] == '\0') {
        pcVar5 = "GL_FALSE";
      }
      if (local_1c0.m_value[1] == '\x01') {
        pcVar5 = "GL_TRUE";
      }
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar5,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean range");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyFloatRange (tcu::TestContext& testCtx, GLenum name, GLfloat min, GLfloat max)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[2]> range;
	glGetBooleanv(name, range);

	if (!range.verifyValidity(testCtx))
		return;

	if (range[0] == GL_FALSE)
	{
		if (max < 0 || min < 0)
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: range [" << min << ", " << max << "] is not in range [" << (range[0] == GL_TRUE ? "GL_TRUE" : (range[0] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << ", " << (range[1] == GL_TRUE ? "GL_TRUE" : (range[1] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << "]"  << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean range");
			return;
		}
	}
	if (range[1] == GL_FALSE)
	{
		if (max > 0 || min > 0)
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: range [" << min << ", " << max << "] is not in range [" << (range[0] == GL_TRUE ? "GL_TRUE" : (range[0] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << ", " << (range[1] == GL_TRUE ? "GL_TRUE" : (range[1] == GL_FALSE ? "GL_FALSE" : "non-boolean")) << "]"  << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean range");
			return;
		}
	}
}